

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzvprintf(gzFile file,char *format,__va_list_tag *va)

{
  int iVar1;
  uint uVar2;
  zng_stream *pzVar3;
  uchar *__s;
  __gnuc_va_list in_RDX;
  gz_state *in_RSI;
  gz_state *in_RDI;
  zng_stream *strm;
  gz_state *state;
  char *next;
  uint left;
  int len;
  gz_state *pgVar4;
  off64_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_4;
  
  if (in_RDI == (gz_state *)0x0) {
    local_4 = 0xfffffffe;
  }
  else {
    pzVar3 = &in_RDI->strm;
    if ((in_RDI->mode == 0x79b1) && (in_RDI->err == 0)) {
      pgVar4 = in_RDI;
      if ((in_RDI->size == 0) && (iVar1 = gz_init(in_RDI), iVar1 == -1)) {
        local_4 = pgVar4->err;
      }
      else {
        if (pgVar4->seek != 0) {
          pgVar4->seek = 0;
          iVar1 = gz_zero((gz_state *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0);
          if (iVar1 == -1) {
            return pgVar4->err;
          }
        }
        if ((in_RDI->strm).avail_in == 0) {
          pzVar3->next_in = pgVar4->in;
        }
        __s = pgVar4->in +
              (long)(pzVar3->next_in + ((ulong)(in_RDI->strm).avail_in - (long)pgVar4->in));
        __s[pgVar4->size - 1] = '\0';
        local_4 = vsnprintf((char *)__s,(ulong)pgVar4->size,(char *)in_RSI,in_RDX);
        if (((local_4 == 0) || (pgVar4->size <= local_4)) || (__s[pgVar4->size - 1] != '\0')) {
          local_4 = 0;
        }
        else {
          (in_RDI->strm).avail_in = local_4 + (in_RDI->strm).avail_in;
          (pgVar4->x).pos = (long)(int)local_4 + (pgVar4->x).pos;
          if (pgVar4->size <= (in_RDI->strm).avail_in) {
            uVar2 = (in_RDI->strm).avail_in - pgVar4->size;
            (in_RDI->strm).avail_in = pgVar4->size;
            iVar1 = gz_comp(in_RSI,(int)((ulong)in_RDX >> 0x20));
            if (iVar1 == -1) {
              local_4 = pgVar4->err;
            }
            else {
              memmove(pgVar4->in,pgVar4->in + pgVar4->size,(ulong)uVar2);
              pzVar3->next_in = pgVar4->in;
              (in_RDI->strm).avail_in = uVar2;
            }
          }
        }
      }
    }
    else {
      local_4 = 0xfffffffe;
    }
  }
  return local_4;
}

Assistant:

int Z_EXPORTVA PREFIX(gzvprintf)(gzFile file, const char *format, va_list va) {
    int len;
    unsigned left;
    char *next;
    gz_state *state;
    PREFIX3(stream) *strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* make sure we have some buffer space */
    if (state->size == 0 && gz_init(state) == -1)
        return state->err;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* do the printf() into the input buffer, put length in len -- the input
       buffer is double-sized just for this function, so there is guaranteed to
       be state->size bytes available after the current contents */
    if (strm->avail_in == 0)
        strm->next_in = state->in;
    next = (char *)(state->in + (strm->next_in - state->in) + strm->avail_in);
    next[state->size - 1] = 0;
    len = vsnprintf(next, state->size, format, va);

    /* check that printf() results fit in buffer */
    if (len == 0 || (unsigned)len >= state->size || next[state->size - 1] != 0)
        return 0;

    /* update buffer and position, compress first half if past that */
    strm->avail_in += (unsigned)len;
    state->x.pos += len;
    if (strm->avail_in >= state->size) {
        left = strm->avail_in - state->size;
        strm->avail_in = state->size;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return state->err;
        memmove(state->in, state->in + state->size, left);
        strm->next_in = state->in;
        strm->avail_in = left;
    }
    return len;
}